

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O3

void __thiscall
llvm::cl::HideUnrelatedOptions
          (cl *this,ArrayRef<const_llvm::cl::OptionCategory_*> Categories,SubCommand *Sub)

{
  long *plVar1;
  cl *pcVar2;
  ulong uVar3;
  long lVar4;
  long *plVar5;
  
  plVar1 = *(long **)(Categories.Length + 0x80);
  uVar3 = (ulong)*(uint *)(Categories.Length + 0x88);
  plVar5 = plVar1;
  if (uVar3 != 0) {
    for (; (*plVar5 == 0 || (*plVar5 == -8)); plVar5 = plVar5 + 1) {
    }
  }
  if (plVar5 != plVar1 + uVar3) {
    lVar4 = *plVar5;
    do {
      pcVar2 = (cl *)std::
                     __find_if<llvm::cl::OptionCategory_const*const*,__gnu_cxx::__ops::_Iter_equals_val<llvm::cl::OptionCategory*const>>
                               (this,this + (long)Categories.Data * 8,*(long *)(lVar4 + 8) + 0x48);
      if ((pcVar2 == this + (long)Categories.Data * 8) &&
         (lVar4 = *(long *)(lVar4 + 8), *(OptionCategory **)(lVar4 + 0x48) != &GenericCategory)) {
        *(ushort *)(lVar4 + 0xc) = (ushort)*(undefined4 *)(lVar4 + 0xc) & 0xff9f | 0x40;
      }
      do {
        do {
          plVar5 = plVar5 + 1;
          lVar4 = *plVar5;
        } while (lVar4 == 0);
      } while (lVar4 == -8);
    } while (plVar5 != plVar1 + uVar3);
  }
  return;
}

Assistant:

void cl::HideUnrelatedOptions(ArrayRef<const cl::OptionCategory *> Categories,
                              SubCommand &Sub) {
  auto CategoriesBegin = Categories.begin();
  auto CategoriesEnd = Categories.end();
  for (auto &I : Sub.OptionsMap) {
    if (std::find(CategoriesBegin, CategoriesEnd, I.second->Category) ==
            CategoriesEnd &&
        I.second->Category != &GenericCategory)
      I.second->setHiddenFlag(cl::ReallyHidden);
  }
}